

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::deleteRows(HighsSparseMatrix *this,HighsIndexCollection *index_collection)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  HighsInt keep_to_row;
  HighsInt current_set_entry;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt keep_from_row;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt local_64 [2];
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  limits(index_collection,&local_50,&local_54);
  if (local_54 < local_50) {
    return;
  }
  iVar11 = this->num_row_;
  local_64[0] = -1;
  local_64[1] = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)iVar11);
  if (index_collection->is_mask_ == true) {
    if (0 < this->num_row_) {
      piVar1 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      uVar10 = 0;
      do {
        iVar11 = piVar1[lVar5];
        uVar8 = -(uint)(iVar11 != 0) | uVar10;
        uVar10 = uVar10 + (iVar11 == 0);
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5] = uVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_row_);
      goto LAB_0037b5f3;
    }
  }
  else {
    local_64[0] = -1;
    local_64[1] = 0;
    if (local_50 <= local_54) {
      uVar10 = 0;
      iVar6 = local_50;
      do {
        updateOutInIndex(index_collection,&local_58,&local_5c,&local_4c,local_64,local_64 + 1);
        if (0 < local_58 && iVar6 == local_50) {
          lVar5 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5] = uVar10 + (int)lVar5;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_58);
          uVar10 = uVar10 + (int)lVar5;
        }
        if (local_58 <= local_5c) {
          lVar5 = (long)local_58 + -1;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5 + 1] = -1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_5c);
        }
        if (local_4c <= local_64[0]) {
          lVar5 = (long)local_4c + -1;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5 + 1] = uVar10;
            uVar10 = uVar10 + 1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_64[0]);
        }
      } while ((local_64[0] < iVar11 + -1) && (bVar4 = iVar6 < local_54, iVar6 = iVar6 + 1, bVar4));
      goto LAB_0037b5f3;
    }
  }
  uVar10 = 0;
LAB_0037b5f3:
  lVar5 = (long)this->num_col_;
  piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar5 < 1) {
    iVar11 = 0;
  }
  else {
    piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = *piVar1;
    lVar7 = 0;
    iVar11 = 0;
    do {
      piVar1[lVar7] = iVar11;
      iVar9 = piVar1[lVar7 + 1];
      lVar7 = lVar7 + 1;
      if (iVar6 < iVar9) {
        pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = (long)iVar6;
        do {
          if (-1 < local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar2[lVar5]]) {
            piVar2[iVar11] =
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar5]];
            pdVar3[iVar11] = pdVar3[lVar5];
            iVar11 = iVar11 + 1;
            iVar9 = piVar1[lVar7];
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar9);
      }
      iVar6 = iVar9;
      lVar5 = (long)this->num_col_;
    } while (lVar7 < lVar5);
  }
  piVar1[lVar5] = iVar11;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)this->num_col_ + 1);
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar11);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar11);
  this->num_row_ = uVar10;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::deleteRows(
    const HighsIndexCollection& index_collection) {
  assert(this->formatOk());
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt row_dim = this->num_row_;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  // Set up a row mask to indicate the new row index of kept rows and
  // -1 for deleted rows so that the kept entries in the column-wise
  // matrix can be identified and have their correct row index.
  vector<HighsInt> new_index;
  new_index.resize(this->num_row_);
  HighsInt new_num_row = 0;
  bool mask = index_collection.is_mask_;
  const vector<HighsInt>& row_mask = index_collection.mask_;
  if (!mask) {
    keep_to_row = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                       keep_from_row, keep_to_row, current_set_entry);
      if (k == from_k) {
        // Account for any initial rows being kept
        for (HighsInt row = 0; row < delete_from_row; row++) {
          new_index[row] = new_num_row;
          new_num_row++;
        }
      }
      for (HighsInt row = delete_from_row; row <= delete_to_row; row++) {
        new_index[row] = -1;
      }
      for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
        new_index[row] = new_num_row;
        new_num_row++;
      }
      if (keep_to_row >= row_dim - 1) break;
    }
  } else {
    for (HighsInt row = 0; row < this->num_row_; row++) {
      if (row_mask[row]) {
        new_index[row] = -1;
      } else {
        new_index[row] = new_num_row;
        new_num_row++;
      }
    }
  }
  HighsInt new_num_nz = 0;
  for (HighsInt col = 0; col < this->num_col_; col++) {
    HighsInt from_el = this->start_[col];
    this->start_[col] = new_num_nz;
    for (HighsInt el = from_el; el < this->start_[col + 1]; el++) {
      HighsInt row = this->index_[el];
      HighsInt new_row = new_index[row];
      if (new_row >= 0) {
        this->index_[new_num_nz] = new_row;
        this->value_[new_num_nz] = this->value_[el];
        new_num_nz++;
      }
    }
  }
  this->start_[this->num_col_] = new_num_nz;
  this->start_.resize(this->num_col_ + 1);
  this->index_.resize(new_num_nz);
  this->value_.resize(new_num_nz);
  // Update the number of rows
  this->num_row_ = new_num_row;
}